

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t *
Gia_ManMiter(Gia_Man_t *p0,Gia_Man_t *p1,int nInsDup,int fDualOut,int fSeq,int fImplic,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p;
  bool bVar7;
  int local_4c;
  int iLit;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fImplic_local;
  int fSeq_local;
  int fDualOut_local;
  int nInsDup_local;
  Gia_Man_t *p1_local;
  Gia_Man_t *p0_local;
  
  if (fSeq == 0) {
    iVar1 = Gia_ManCiNum(p0);
    iVar2 = Gia_ManCiNum(p1);
    if (iVar1 != iVar2) {
      printf("Gia_ManMiter(): Designs have different number of CIs.\n");
      return (Gia_Man_t *)0x0;
    }
    iVar1 = Gia_ManCoNum(p0);
    iVar2 = Gia_ManCoNum(p1);
    if (iVar1 != iVar2) {
      printf("Gia_ManMiter(): Designs have different number of COs.\n");
      return (Gia_Man_t *)0x0;
    }
  }
  else {
    iVar1 = Gia_ManPiNum(p0);
    iVar2 = Gia_ManPiNum(p1);
    if (iVar1 != iVar2) {
      printf("Gia_ManMiter(): Designs have different number of PIs.\n");
      return (Gia_Man_t *)0x0;
    }
    iVar1 = Gia_ManPoNum(p0);
    iVar2 = Gia_ManPoNum(p1);
    if (iVar1 != iVar2) {
      printf("Gia_ManMiter(): Designs have different number of POs.\n");
      return (Gia_Man_t *)0x0;
    }
    iVar1 = Gia_ManRegNum(p0);
    if ((iVar1 == 0) || (iVar1 = Gia_ManRegNum(p1), iVar1 == 0)) {
      printf("Gia_ManMiter(): At least one of the designs has no registers.\n");
      return (Gia_Man_t *)0x0;
    }
  }
  iVar1 = Gia_ManObjNum(p0);
  iVar2 = Gia_ManObjNum(p1);
  pGVar4 = Gia_ManStart(iVar1 + iVar2);
  pcVar5 = Abc_UtilStrsav("miter");
  pGVar4->pName = pcVar5;
  Gia_ManFillValue(p0);
  Gia_ManFillValue(p1);
  pGVar6 = Gia_ManConst0(p0);
  pGVar6->Value = 0;
  pGVar6 = Gia_ManConst0(p1);
  pGVar6->Value = 0;
  Gia_ManHashAlloc(pGVar4);
  if (fSeq == 0) {
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p0->vCis);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCi(p0,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(pGVar4);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p1->vCis);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCi(p1,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ManCiNum(p1);
      if (local_4c < iVar1 - nInsDup) {
        pGVar6 = Gia_ManCi(pGVar4,local_4c);
        uVar3 = Gia_ObjToLit(pGVar4,pGVar6);
        _iLit->Value = uVar3;
      }
      else {
        uVar3 = Gia_ManAppendCi(pGVar4);
        _iLit->Value = uVar3;
      }
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p0->vCos);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCo(p0,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_iLit);
      Gia_ManMiter_rec(pGVar4,p0,pGVar6);
      pGVar6 = Gia_ManCo(p1,local_4c);
      pGVar6 = Gia_ObjFanin0(pGVar6);
      Gia_ManMiter_rec(pGVar4,p1,pGVar6);
      if (fDualOut == 0) {
        if (fImplic == 0) {
          iVar1 = Gia_ObjFanin0Copy(_iLit);
          pGVar6 = Gia_ManCo(p1,local_4c);
          iVar2 = Gia_ObjFanin0Copy(pGVar6);
          iVar1 = Gia_ManHashXor(pGVar4,iVar1,iVar2);
          Gia_ManAppendCo(pGVar4,iVar1);
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_iLit);
          pGVar6 = Gia_ManPo(p1,local_4c);
          iVar2 = Gia_ObjFanin0Copy(pGVar6);
          iVar2 = Abc_LitNot(iVar2);
          iVar1 = Gia_ManHashAnd(pGVar4,iVar1,iVar2);
          Gia_ManAppendCo(pGVar4,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_iLit);
        Gia_ManAppendCo(pGVar4,iVar1);
        pGVar6 = Gia_ManCo(p1,local_4c);
        iVar1 = Gia_ObjFanin0Copy(pGVar6);
        Gia_ManAppendCo(pGVar4,iVar1);
      }
      local_4c = local_4c + 1;
    }
  }
  else {
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p0);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCi(p0,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(pGVar4);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p1);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCi(p1,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ManPiNum(p1);
      if (local_4c < iVar1 - nInsDup) {
        pGVar6 = Gia_ManPi(pGVar4,local_4c);
        uVar3 = Gia_ObjToLit(pGVar4,pGVar6);
        _iLit->Value = uVar3;
      }
      else {
        uVar3 = Gia_ManAppendCi(pGVar4);
        _iLit->Value = uVar3;
      }
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p0);
      bVar7 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPiNum(p0);
        _iLit = Gia_ManCi(p0,iVar1 + local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(pGVar4);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p1);
      bVar7 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPiNum(p1);
        _iLit = Gia_ManCi(p1,iVar1 + local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar3 = Gia_ManAppendCi(pGVar4);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p0);
      bVar7 = false;
      if (local_4c < iVar1) {
        _iLit = Gia_ManCo(p0,local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_iLit);
      Gia_ManMiter_rec(pGVar4,p0,pGVar6);
      pGVar6 = Gia_ManPo(p1,local_4c);
      pGVar6 = Gia_ObjFanin0(pGVar6);
      Gia_ManMiter_rec(pGVar4,p1,pGVar6);
      if (fDualOut == 0) {
        if (fImplic == 0) {
          iVar1 = Gia_ObjFanin0Copy(_iLit);
          pGVar6 = Gia_ManPo(p1,local_4c);
          iVar2 = Gia_ObjFanin0Copy(pGVar6);
          iVar1 = Gia_ManHashXor(pGVar4,iVar1,iVar2);
          Gia_ManAppendCo(pGVar4,iVar1);
        }
        else {
          iVar1 = Gia_ObjFanin0Copy(_iLit);
          pGVar6 = Gia_ManPo(p1,local_4c);
          iVar2 = Gia_ObjFanin0Copy(pGVar6);
          iVar2 = Abc_LitNot(iVar2);
          iVar1 = Gia_ManHashAnd(pGVar4,iVar1,iVar2);
          Gia_ManAppendCo(pGVar4,iVar1);
        }
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_iLit);
        Gia_ManAppendCo(pGVar4,iVar1);
        pGVar6 = Gia_ManPo(p1,local_4c);
        iVar1 = Gia_ObjFanin0Copy(pGVar6);
        Gia_ManAppendCo(pGVar4,iVar1);
      }
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p0);
      bVar7 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPoNum(p0);
        _iLit = Gia_ManCo(p0,iVar1 + local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_iLit);
      Gia_ManMiter_rec(pGVar4,p0,pGVar6);
      iVar1 = Gia_ObjFanin0Copy(_iLit);
      uVar3 = Gia_ManAppendCo(pGVar4,iVar1);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p1);
      bVar7 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPoNum(p1);
        _iLit = Gia_ManCo(p1,iVar1 + local_4c);
        bVar7 = _iLit != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(_iLit);
      Gia_ManMiter_rec(pGVar4,p1,pGVar6);
      iVar1 = Gia_ObjFanin0Copy(_iLit);
      uVar3 = Gia_ManAppendCo(pGVar4,iVar1);
      _iLit->Value = uVar3;
      local_4c = local_4c + 1;
    }
    iVar1 = Gia_ManRegNum(p0);
    iVar2 = Gia_ManRegNum(p1);
    Gia_ManSetRegNum(pGVar4,iVar1 + iVar2);
  }
  Gia_ManHashStop(pGVar4);
  p = Gia_ManCleanup(pGVar4);
  Gia_ManStop(pGVar4);
  pGVar4 = Gia_ManDupNormalize(p,0);
  Gia_ManStop(p);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManMiter( Gia_Man_t * p0, Gia_Man_t * p1, int nInsDup, int fDualOut, int fSeq, int fImplic, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit;
    if ( fSeq )
    {
        if ( Gia_ManPiNum(p0) != Gia_ManPiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of PIs.\n" );
            return NULL;
        }
        if ( Gia_ManPoNum(p0) != Gia_ManPoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of POs.\n" );
            return NULL;
        }
        if ( Gia_ManRegNum(p0) == 0 || Gia_ManRegNum(p1) == 0 )
        {
            printf( "Gia_ManMiter(): At least one of the designs has no registers.\n" );
            return NULL;
        }
    }
    else
    {
        if ( Gia_ManCiNum(p0) != Gia_ManCiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of CIs.\n" );
            return NULL;
        }
        if ( Gia_ManCoNum(p0) != Gia_ManCoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of COs.\n" );
            return NULL;
        }
    }
    // start the manager
    pNew = Gia_ManStart( Gia_ManObjNum(p0) + Gia_ManObjNum(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map combinational inputs
    Gia_ManFillValue( p0 );
    Gia_ManFillValue( p1 );
    Gia_ManConst0(p0)->Value = 0;
    Gia_ManConst0(p1)->Value = 0;
    // map internal nodes and outputs
    Gia_ManHashAlloc( pNew );
    if ( fSeq )
    {
        // create primary inputs
        Gia_ManForEachPi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPi( p1, pObj, i )
            if ( i < Gia_ManPiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManPi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create latch outputs
        Gia_ManForEachRo( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p1, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        // create primary outputs
        Gia_ManForEachPo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManPo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else 
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
        // create register inputs
        Gia_ManForEachRi( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManForEachRi( p1, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p0) + Gia_ManRegNum(p1) );
    }
    else
    {
        // create combinational inputs
        Gia_ManForEachCi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachCi( p1, pObj, i )
            if ( i < Gia_ManCiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManCi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create combinational outputs
        Gia_ManForEachCo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManCo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}